

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void SHA256_Final_Y(uchar *digest,SHA256_CTX_Y *ctx)

{
  void *in_RSI;
  uint32_t *in_RDI;
  SHA256_CTX_Y *unaff_retaddr;
  
  SHA256_Pad(unaff_retaddr);
  be32enc_vect((uchar *)unaff_retaddr,in_RDI,(size_t)in_RSI);
  memset(in_RSI,0,0x68);
  return;
}

Assistant:

void
SHA256_Final_Y(unsigned char digest[32], SHA256_CTX_Y * ctx)
{

	/* Add padding */
	SHA256_Pad(ctx);

	/* Write the hash */
	be32enc_vect(digest, ctx->state, 32);

	/* Clear the context state */
	memset((void *)ctx, 0, sizeof(*ctx));
}